

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O1

BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG> * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG>::operator()
          (BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG> *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *bg)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG> *this_00;
  
  if (1 < this->_m_verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "BGIP_SolverCreator_AM:: creating a new BGIP_SolverAlternatingMaximization with nrRestarts="
               ,0x5a);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", verbose=",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_m_verbose);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", nrSols=",9);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  this_00 = (BGIP_SolverAlternatingMaximization<JointPolicyPureVectorForClusteredBG> *)
            operator_new(0x128);
  sVar2 = this->_m_nrRestarts;
  iVar1 = this->_m_verbose;
  BayesianGameIdenticalPayoffSolver::BayesianGameIdenticalPayoffSolver
            ((BayesianGameIdenticalPayoffSolver *)this_00,(shared_ptr *)bg,this->_m_nrSolutions);
  (this_00->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>).
  super_BGIP_IncrementalSolverInterface._m_nrSolutionsReturned = 0;
  *(undefined ***)
   &(this_00->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>).
    super_BGIP_IncrementalSolverInterface = &PTR_InitDeadline_0012c4a0;
  this_00->_m_nrRestarts = (uint)sVar2;
  this_00->_m_verbose = iVar1;
  this_00->_m_solved = false;
  *(double *)
   &(this_00->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>).
    super_BGIP_IncrementalSolverInterface.field_0xe0 = this->_m_deadlineInSeconds;
  return this_00;
}

Assistant:

BGIP_SolverAlternatingMaximization<JP>* operator()
        (const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &bg) const
        {
            if(_m_verbose >= 2)
            {
                std::cout << "BGIP_SolverCreator_AM:: creating a new BGIP_SolverAlternatingMaximization with nrRestarts=" << _m_nrRestarts<< ", verbose=" << _m_verbose << ", nrSols="<<_m_nrSolutions << std::endl;
            }
            BGIP_SolverAlternatingMaximization<JP>* bgsolver=
                new BGIP_SolverAlternatingMaximization<JP>(
                    bg,
                    _m_nrRestarts,
                    _m_verbose,
                    _m_nrSolutions);
            bgsolver->SetDeadline(_m_deadlineInSeconds);
            return(bgsolver);
        }